

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock_test.c
# Opt level: O3

void test_dial_url(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  nng_url *local_48;
  nng_url *u2;
  nng_dialer d;
  nng_socket s1;
  nng_url *u;
  
  nVar1 = nng_pair1_open((nng_socket *)((long)&u2 + 4));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                         ,0x1b7,"%s: expected success, got %s (%d)","nng_pair1_open(&(s1))",pcVar3,
                         nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_url_parse((nng_url **)&d,"inproc://dial_url");
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                           ,0x1b8,"%s: expected success, got %s (%d)",
                           "nng_url_parse(&u, \"inproc://dial_url\")",pcVar3,nVar1);
    if (iVar2 != 0) {
      nVar1 = nng_dial_url(u2._4_4_,_d,(nng_dialer *)&u2,2);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                             ,0x1ba,"%s: expected success, got %s (%d)",
                             "nng_dial_url(s1, u, &d, NNG_FLAG_NONBLOCK)",pcVar3,nVar1);
      if (iVar2 != 0) {
        nng_dialer_get_url(u2._0_4_,&local_48);
        pcVar3 = nng_url_scheme(_d);
        pcVar4 = nng_url_scheme(local_48);
        iVar2 = strcmp(pcVar3,pcVar4);
        pcVar3 = nng_url_scheme(_d);
        pcVar4 = nng_url_scheme(local_48);
        acutest_check_((uint)(iVar2 == 0),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                       ,0x1bd,"%s == %s",pcVar3,pcVar4);
        pcVar3 = nng_url_path(_d);
        pcVar4 = nng_url_path(local_48);
        iVar2 = strcmp(pcVar3,pcVar4);
        pcVar3 = nng_url_path(_d);
        pcVar4 = nng_url_path(local_48);
        acutest_check_((uint)(iVar2 == 0),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                       ,0x1be,"%s == %s",pcVar3,pcVar4);
        nng_url_free(_d);
        nVar1 = nng_socket_close(u2._4_4_);
        pcVar3 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                               ,0x1c1,"%s: expected success, got %s (%d)","nng_socket_close(s1)",
                               pcVar3,nVar1);
        if (iVar2 != 0) {
          return;
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_dial_url(void)
{
	nng_socket     s1;
	nng_dialer     d;
	nng_url       *u;
	const nng_url *u2;

	NUTS_OPEN(s1);
	NUTS_PASS(nng_url_parse(&u, "inproc://dial_url"));

	NUTS_PASS(nng_dial_url(s1, u, &d, NNG_FLAG_NONBLOCK));
	nng_dialer_get_url(d, &u2);

	NUTS_MATCH(nng_url_scheme(u), nng_url_scheme(u2));
	NUTS_MATCH(nng_url_path(u), nng_url_path(u2));
	nng_url_free(u);

	NUTS_CLOSE(s1);
}